

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-serialization.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  uint j;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  vector<Point,_std::allocator<Point>_> points;
  Point p;
  MemoryBuffer local_78;
  
  local_78.super_BinaryBuffer._vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_00106cf8;
  local_78.position = 0;
  local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.blob_position = 0;
  local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.blobs.super__Vector_base<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p.coords[2] = 5;
  p.coords[0] = 5;
  p.coords[1] = 5;
  std::vector<Point,_std::allocator<Point>_>::push_back(&points,&p);
  p.coords[0] = 1;
  std::vector<Point,_std::allocator<Point>_>::push_back(&points,&p);
  p.coords[2] = 1;
  std::vector<Point,_std::allocator<Point>_>::push_back(&points,&p);
  diy::Serialization<std::vector<Point,_std::allocator<Point>_>_>::save
            (&local_78.super_BinaryBuffer,&points);
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
            (&points.super__Vector_base<Point,_std::allocator<Point>_>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  PointVec::PointVec((PointVec *)&p,3);
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&points,(value_type *)&p);
  *(undefined4 *)p.coords._0_8_ = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&points,(value_type *)&p);
  *(undefined4 *)(p.coords._0_8_ + 8) = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)&points,(value_type *)&p);
  diy::Serialization<std::vector<PointVec,_std::allocator<PointVec>_>_>::save
            (&local_78.super_BinaryBuffer,(Vector *)&points);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&p);
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)&points);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_78.position = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::Serialization<std::vector<Point,_std::allocator<Point>_>_>::load
            (&local_78.super_BinaryBuffer,&points);
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0xc);
      uVar4 = (ulong)((int)uVar4 + 1)) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4].coords[lVar2]);
      std::operator<<(poVar1,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::_Vector_base<Point,_std::allocator<Point>_>::~_Vector_base
            (&points.super__Vector_base<Point,_std::allocator<Point>_>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::Serialization<std::vector<PointVec,_std::allocator<PointVec>_>_>::load
            (&local_78.super_BinaryBuffer,(Vector *)&points);
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)(((long)points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)points.super__Vector_base<Point,_std::allocator<Point>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [(ulong)uVar3 * 2].coords + lVar2 * 4));
      std::operator<<(poVar1,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)&points);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  diy::MemoryBuffer::~MemoryBuffer(&local_78);
  return 0;
}

Assistant:

int main()
{
  diy::MemoryBuffer bb;
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    Point p; p[0] = p[1] = p[2] = 5;
    points.push_back(p);
    p[0] = 1;
    points.push_back(p);
    p[2] = 1;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    PointVec p(3);
    points.push_back(p);
    p[0] = 2;
    points.push_back(p);
    p[2] = 2;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  bb.reset();
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;
}